

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void initEndData(chainEndData_t *ed)

{
  int local_14;
  int i;
  chainEndData_t *ed_local;
  
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    ed->ambigN[local_14] = (atom *)0x0;
    ed->ambigO[local_14] = (atom *)0x0;
  }
  ed->res_mc_oxy_cnt = 0;
  ed->first = 0;
  ed->last = 0;
  ed->Ntmarkers = 0;
  ed->Ctmarkers = 0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    ed->hisNHcount[local_14] = 0;
  }
  return;
}

Assistant:

void initEndData(chainEndData_t *ed)
{
   int i = 0;
   for (i = 0; i < 8; i++) { ed->ambigN[i] = NULL; ed->ambigO[i] = NULL; }
   ed->res_mc_oxy_cnt = 0;
   ed->first = 0;
   ed->last  = 0;
   ed->Ntmarkers = 0;
   ed->Ctmarkers = 0;
   for (i = 0; i < 4; i++) { ed->hisNHcount[i] = 0; }
}